

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Pressure> metaf::Pressure::fromString(string *s)

{
  char cVar1;
  bool bVar2;
  optional<unsigned_int> oVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  optional<metaf::Pressure> oVar8;
  
  if (s->_M_string_length != 5) goto LAB_00190737;
  uVar6 = 0x100000000;
  bVar2 = std::operator==(s,"A////");
  if (bVar2) {
    uVar5 = 0x100000001;
  }
  else {
    bVar2 = std::operator==(s,"Q////");
    uVar5 = uVar6;
    if (!bVar2) {
      oVar3 = strToUint(s,1,4);
      if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
        cVar1 = *(s->_M_dataplus)._M_p;
        if (cVar1 == 'Q') {
          fVar7 = (float)((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int> & 0xffffffff);
          uVar5 = 0x100000000;
        }
        else {
          if (cVar1 != 'A') goto LAB_00190737;
          fVar7 = (float)((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int> & 0xffffffff) * 0.01;
          uVar5 = 0x100000001;
        }
        uVar4 = (ulong)(uint)fVar7;
        goto LAB_0019073e;
      }
LAB_00190737:
      uVar5 = 0;
    }
  }
  uVar4 = 0;
  uVar6 = 0;
LAB_0019073e:
  oVar8.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Pressure>._M_payload._0_8_ = uVar4 | uVar6;
  oVar8.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Pressure>._8_8_ = uVar5;
  return (optional<metaf::Pressure>)
         oVar8.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Pressure>;
}

Assistant:

std::optional<Pressure> Pressure::fromString(const std::string & s) {
	//static const std::regex rgx("([QA])(?:(\\d\\d\\d\\d)|////)");
	static const std::optional<Pressure> error;
	if (s.length() != 5) return error;
	Pressure pressure;
	if (s == "A////") {
		pressure.pressureUnit = Unit::INCHES_HG;
		return pressure;
	}
	if (s == "Q////") {
		pressure.pressureUnit = Unit::HECTOPASCAL;
		return pressure;
	}
	const auto pr = strToUint(s, 1, 4);
	if (!pr.has_value()) return error;
	switch (s[0]) {
		case 'A':
			pressure.pressureUnit = Unit::INCHES_HG;
			pressure.pressureValue = *pr * inHgDecimalPointShift;
			break;
		case 'Q':
			pressure.pressureUnit = Unit::HECTOPASCAL;
			pressure.pressureValue = *pr;
			break;
		default:  return error;
	}
	return pressure;
}